

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frobtadsappcurses.cc
# Opt level: O3

void __thiscall
FrobTadsApplicationCurses::~FrobTadsApplicationCurses(FrobTadsApplicationCurses *this)

{
  uint *puVar1;
  FrobTadsWindow *__ptr;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  (this->super_FrobTadsApplication)._vptr_FrobTadsApplication = (_func_int **)&PTR_init_003497e0;
  curs_set(0);
  if ((this->super_FrobTadsApplication).options.exitPause == false) {
    wrefresh(((_Head_base<0UL,__win_st_*,_false> *)
             ((long)&(((this->fGameWindow)._M_t.
                       super___uniq_ptr_impl<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_FrobTadsWindow_*,_std::default_delete<FrobTadsWindow>_>
                       .super__Head_base<0UL,_FrobTadsWindow_*,_false>._M_head_impl)->fWin)._M_t + 8
             ))->_M_head_impl);
  }
  endwin();
  puVar1 = (this->fDispBuf)._M_t.
           super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
           super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
  if (puVar1 != (uint *)0x0) {
    operator_delete__(puVar1);
  }
  (this->fDispBuf)._M_t.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
  super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl = (uint *)0x0;
  __ptr = (this->fGameWindow)._M_t.
          super___uniq_ptr_impl<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_>._M_t.
          super__Tuple_impl<0UL,_FrobTadsWindow_*,_std::default_delete<FrobTadsWindow>_>.
          super__Head_base<0UL,_FrobTadsWindow_*,_false>._M_head_impl;
  if (__ptr != (FrobTadsWindow *)0x0) {
    std::default_delete<FrobTadsWindow>::operator()
              ((default_delete<FrobTadsWindow> *)&this->fGameWindow,__ptr);
  }
  (this->fGameWindow)._M_t.
  super___uniq_ptr_impl<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_>._M_t.
  super__Tuple_impl<0UL,_FrobTadsWindow_*,_std::default_delete<FrobTadsWindow>_>.
  super__Head_base<0UL,_FrobTadsWindow_*,_false>._M_head_impl = (FrobTadsWindow *)0x0;
  (this->super_FrobTadsApplication)._vptr_FrobTadsApplication =
       (_func_int **)&PTR___cxa_pure_virtual_003496d0;
  pcVar2 = (this->super_FrobTadsApplication).options.cmdLogFile._M_dataplus._M_p;
  paVar3 = &(this->super_FrobTadsApplication).options.cmdLogFile.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->super_FrobTadsApplication).options.replayFile._M_dataplus._M_p;
  paVar3 = &(this->super_FrobTadsApplication).options.replayFile.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->super_FrobTadsApplication).options.characterSet._M_dataplus._M_p;
  paVar3 = &(this->super_FrobTadsApplication).options.characterSet.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

FrobTadsApplicationCurses::~FrobTadsApplicationCurses()
{
    // Enable the cursor.
    curs_set(0);

    // Flush any pending output so we won't lose any "thanks for
    // playing" messages when "pausing prior to exit" is disabled.
    if (not this->options.exitPause)
        this->fGameWindow->flush();

    // Shut down curses.
    endwin();
}